

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastCallback.cpp
# Opt level: O0

void __thiscall
btTriangleConvexcastCallback::btTriangleConvexcastCallback
          (btTriangleConvexcastCallback *this,btConvexShape *convexShape,
          btTransform *convexShapeFrom,btTransform *convexShapeTo,btTransform *triangleToWorld,
          btScalar triangleCollisionMargin)

{
  undefined8 in_RSI;
  btTransform *in_RDI;
  btScalar in_XMM0_Da;
  btTransform *in_stack_ffffffffffffffc0;
  
  btTriangleCallback::btTriangleCallback((btTriangleCallback *)in_RDI);
  *(undefined ***)(in_RDI->m_basis).m_el[0].m_floats = &PTR__btTriangleConvexcastCallback_002e6bf0;
  btTransform::btTransform(in_stack_ffffffffffffffc0);
  btTransform::btTransform(in_stack_ffffffffffffffc0);
  btTransform::btTransform(in_stack_ffffffffffffffc0);
  *(undefined8 *)((in_RDI->m_basis).m_el[0].m_floats + 2) = in_RSI;
  btTransform::operator=(in_stack_ffffffffffffffc0,in_RDI);
  btTransform::operator=(in_stack_ffffffffffffffc0,in_RDI);
  btTransform::operator=(in_stack_ffffffffffffffc0,in_RDI);
  in_RDI[3].m_basis.m_el[1].m_floats[0] = 1.0;
  in_RDI[3].m_basis.m_el[1].m_floats[1] = in_XMM0_Da;
  in_RDI[3].m_basis.m_el[1].m_floats[2] = 0.0;
  return;
}

Assistant:

btTriangleConvexcastCallback::btTriangleConvexcastCallback (const btConvexShape* convexShape, const btTransform& convexShapeFrom, const btTransform& convexShapeTo, const btTransform& triangleToWorld, const btScalar triangleCollisionMargin)
{
	m_convexShape = convexShape;
	m_convexShapeFrom = convexShapeFrom;
	m_convexShapeTo = convexShapeTo;
	m_triangleToWorld = triangleToWorld;
	m_hitFraction = 1.0f;
	m_triangleCollisionMargin = triangleCollisionMargin;
	m_allowedPenetration = 0.f;
}